

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
MADPComponentFactoredStates::StateIndexToFactorValueIndices
          (MADPComponentFactoredStates *this,Index s_e,Scope *sfSC)

{
  allocator_type *__a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_sf_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *s_e_vec;
  Scope *sc;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  Index in_stack_ffffffffffffffcc;
  
  __a = (allocator_type *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RCX);
  sc = (Scope *)&stack0xffffffffffffffc7;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xafeb7b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(size_type)sc,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xafeb9b);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),sc,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  IndexTools::JointToIndividualIndices(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  return in_RDI;
}

Assistant:

vector<Index> MADPComponentFactoredStates::
StateIndexToFactorValueIndices(Index s_e, 
        const Scope& sfSC) const
{
    vector<size_t> nr_sf_e(sfSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        _m_sfacDomainSizes, sfSC, nr_sf_e);
    vector<Index> s_e_vec = IndexTools::JointToIndividualIndices(s_e, nr_sf_e);
    return(s_e_vec);
}